

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall minja::IfExpr::do_evaluate(IfExpr *this,shared_ptr<minja::Context> *context)

{
  bool bVar1;
  byte bVar2;
  runtime_error *prVar3;
  long in_RSI;
  Value *in_RDI;
  shared_ptr<minja::Context> *in_stack_00000130;
  Expression *in_stack_00000138;
  nullptr_t *ppvVar4;
  undefined7 in_stack_ffffffffffffff50;
  Value *this_00;
  nullptr_t local_78 [15];
  
  this_00 = in_RDI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x20));
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"IfExpr.condition is null");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x30));
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"IfExpr.then_expr is null");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x317f62);
  ppvVar4 = local_78;
  Expression::evaluate(in_stack_00000138,in_stack_00000130);
  bVar2 = Value::to_bool(this_00);
  Value::~Value((Value *)CONCAT17(bVar2,in_stack_ffffffffffffff50));
  if ((bVar2 & 1) == 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x40));
    if (bVar1) {
      std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x318005);
      Expression::evaluate(in_stack_00000138,in_stack_00000130);
    }
    else {
      Value::Value((Value *)CONCAT17(bVar2,in_stack_ffffffffffffff50),ppvVar4);
    }
  }
  else {
    std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x317fac);
    Expression::evaluate(in_stack_00000138,in_stack_00000130);
  }
  return in_RDI;
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
      if (!condition) throw std::runtime_error("IfExpr.condition is null");
      if (!then_expr) throw std::runtime_error("IfExpr.then_expr is null");
      if (condition->evaluate(context).to_bool()) {
        return then_expr->evaluate(context);
      }
      if (else_expr) {
        return else_expr->evaluate(context);
      }
      return nullptr;
    }